

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::(anonymous_namespace)::EncodeDecodeTest_EncodeDeterministicOutput_Test::
~EncodeDecodeTest_EncodeDeterministicOutput_Test
          (EncodeDecodeTest_EncodeDeterministicOutput_Test *this)

{
  compiler::anon_unknown_0::EncodeDecodeTest_EncodeDeterministicOutput_Test::
  ~EncodeDecodeTest_EncodeDeterministicOutput_Test
            ((EncodeDecodeTest_EncodeDeterministicOutput_Test *)(this + -0x10));
  return;
}

Assistant:

TEST_P(EncodeDecodeTest, EncodeDeterministicOutput) {
  std::string golden_path = absl::StrCat(TestTempDir(), "/golden_message");
  WriteGoldenMessage(golden_path);
  RedirectStdinFromFile(TestUtil::GetTestDataPath(
      "google/protobuf/"
      "testdata/text_format_unittest_data_oneof_implemented.txt"));
  std::string args;
  if (GetParam() != DESCRIPTOR_SET_IN) {
    args.append("google/protobuf/unittest.proto");
  }
  EXPECT_TRUE(Run(absl::StrCat(
      args, " --encode=proto2_unittest.TestAllTypes --deterministic_output")));
  ExpectStdoutMatchesBinaryFile(golden_path);
  ExpectNoErrors();
}